

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.h
# Opt level: O2

bool __thiscall winmd::reader::filter::includes(filter *this,TypeDef *type)

{
  bool bVar1;
  string_view local_38;
  string_view local_28;
  
  local_28 = TypeDef::TypeNamespace(type);
  local_38 = TypeDef::TypeName(type);
  bVar1 = includes(this,&local_28,&local_38);
  return bVar1;
}

Assistant:

bool includes(TypeDef const& type) const
        {
            return includes(type.TypeNamespace(), type.TypeName());
        }